

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_(char *file,int line)

{
  int in_EDX;
  char *in_RSI;
  string *in_RDI;
  string file_name;
  char *local_a8;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_70 [32];
  undefined4 local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  
  local_a8 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_a8 = "unknown file";
  }
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_a8,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (local_14 < 0) {
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  else {
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    StreamableToString<int>((int *)in_stack_ffffffffffffff78);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_70);
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}